

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deTimer.c
# Opt level: O1

deTimer * deTimer_create(deTimerCallback callback,void *arg)

{
  int iVar1;
  sigval_t ptr;
  sigevent sevp;
  sigval_t local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  ptr.sival_ptr = deCalloc(0x20);
  if ((deTimer *)ptr.sival_ptr != (deTimer *)0x0) {
    uStack_40 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    uStack_50 = 0x200000000;
    local_48 = timerCallback;
    local_58.sival_ptr = ptr.sival_ptr;
    iVar1 = timer_create(0,(sigevent *)&local_58,(timer_t *)((long)ptr.sival_ptr + 0x10));
    if (iVar1 == 0) {
      *(deTimerCallback *)ptr.sival_ptr = callback;
      *(void **)((long)ptr.sival_ptr + 8) = arg;
      *(deBool *)((long)ptr.sival_ptr + 0x18) = 0;
      return (deTimer *)ptr.sival_ptr;
    }
    deFree(ptr.sival_ptr);
  }
  return (deTimer *)0x0;
}

Assistant:

deTimer* deTimer_create (deTimerCallback callback, void* arg)
{
	deTimer*		timer = (deTimer*)deCalloc(sizeof(deTimer));
	struct sigevent	sevp;

	if (!timer)
		return DE_NULL;

	deMemset(&sevp, 0, sizeof(sevp));
	sevp.sigev_notify			= SIGEV_THREAD;
	sevp.sigev_value.sival_ptr	= timer;
	sevp.sigev_notify_function	= timerCallback;

	if (timer_create(CLOCK_REALTIME, &sevp, &timer->timer) != 0)
	{
		deFree(timer);
		return DE_NULL;
	}

	timer->callback		= callback;
	timer->callbackArg	= arg;
	timer->isActive		= DE_FALSE;

	return timer;
}